

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

Integer * copy_map(int *block,int block_ndim,int *map)

{
  int iVar1;
  ulong uVar2;
  Integer *pIVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  if (block_ndim < 1) {
    iVar6 = 0;
  }
  else {
    uVar2 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + block[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)block_ndim != uVar2);
  }
  pIVar3 = (Integer *)malloc((long)iVar6 << 3);
  if (0 < block_ndim) {
    uVar2 = 0;
    iVar4 = 0;
    do {
      iVar1 = block[uVar2];
      iVar6 = iVar6 - iVar1;
      if (0 < (long)iVar1) {
        lVar5 = 0;
        do {
          pIVar3[iVar6 + lVar5] = (long)map[iVar4 + lVar5] + 1;
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      iVar4 = iVar1 + iVar4;
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)block_ndim);
  }
  return pIVar3;
}

Assistant:

static Integer* copy_map(int block[], int block_ndim, int map[])
{
    int d;
    int i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}